

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

int Ppmd7_DecodeSymbol(CPpmd7 *p,IPpmd7_RangeDec *rc)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ushort uVar5;
  CPpmd_State *pCVar6;
  CPpmd_State *pCVar7;
  Byte BVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  CPpmd_See *pCVar12;
  CPpmd_State *pCVar13;
  undefined8 *in_RSI;
  CPpmd7 *in_RDI;
  CPpmd_State **pps;
  Byte symbol_3;
  int k;
  uint numMasked;
  uint num;
  uint i_1;
  CPpmd_See *see;
  UInt32 hiCnt_1;
  UInt32 count_1;
  UInt32 freqSum;
  CPpmd_State *s_1;
  CPpmd_State *ps [256];
  uint j_1;
  Byte symbol_2;
  UInt16 *prob;
  uint j;
  Byte symbol_1;
  Byte symbol;
  UInt32 hiCnt;
  UInt32 count;
  uint i;
  CPpmd_State *s;
  size_t charMask [32];
  long *local_988;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  byte bVar14;
  uint local_96c;
  uint local_95c;
  uint local_954;
  CPpmd_State *local_950;
  long local_948 [256];
  uint local_148;
  byte local_141;
  UInt16 *local_140;
  uint local_134;
  byte local_12e;
  byte local_12d;
  uint local_12c;
  uint local_128;
  int local_124;
  CPpmd_State *local_120;
  char acStack_118 [8];
  CPpmd7 *apCStack_110 [34];
  
  apCStack_110[0x1f] = (CPpmd7 *)in_RSI;
  apCStack_110[0x20] = in_RDI;
  if (in_RDI->MinContext->NumStats == 1) {
    bVar14 = *(byte *)((long)&in_RDI->MinContext->SummFreq + 1);
    bVar2 = in_RDI->NS2BSIndx[(int)(*(ushort *)(in_RDI->Base + in_RDI->MinContext->Suffix) - 1)];
    bVar3 = in_RDI->HB2Flag[in_RDI->FoundState->Symbol];
    in_RDI->HiBitsFlag = (uint)bVar3;
    local_140 = in_RDI->BinSumm[(int)(bVar14 - 1)] +
                (in_RDI->PrevSuccess + (uint)bVar2 + (uint)bVar3 +
                 (uint)in_RDI->HB2Flag[(byte)in_RDI->MinContext->SummFreq] * 2 +
                (in_RDI->RunLength >> 0x1a & 0x20U));
    iVar9 = (*(code *)in_RSI[2])(in_RSI,*local_140);
    if (iVar9 == 0) {
      *local_140 = (*local_140 + 0x80) - (short)((int)(*local_140 + 0x20) >> 7);
      apCStack_110[0x20]->FoundState = (CPpmd_State *)&apCStack_110[0x20]->MinContext->SummFreq;
      local_141 = (byte)apCStack_110[0x20]->MinContext->SummFreq;
      Ppmd7_UpdateBin((CPpmd7 *)0x1995ec);
      return (uint)local_141;
    }
    *local_140 = *local_140 - (short)((int)(*local_140 + 0x20) >> 7);
    apCStack_110[0x20]->InitEsc =
         (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
               [(int)(uint)*local_140 >> 10];
    for (local_148 = 0; local_148 < 0x20; local_148 = local_148 + 8) {
      pcVar1 = acStack_118 + (ulong)local_148 * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 1) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 2) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 3) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 4) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 5) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 6) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_148 + 7) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
    }
    acStack_118[(byte)apCStack_110[0x20]->MinContext->SummFreq] = '\0';
    apCStack_110[0x20]->PrevSuccess = 0;
  }
  else {
    local_120 = (CPpmd_State *)(in_RDI->Base + in_RDI->MinContext->Stats);
    local_128 = (*(code *)*in_RSI)(in_RSI,in_RDI->MinContext->SummFreq);
    local_12c = (uint)local_120->Freq;
    if (local_128 < local_12c) {
      (**(code **)((long)apCStack_110[0x1f] + 8))(apCStack_110[0x1f],0,local_120->Freq);
      apCStack_110[0x20]->FoundState = local_120;
      local_12d = local_120->Symbol;
      Ppmd7_Update1_0((CPpmd7 *)0x19919b);
      return (uint)local_12d;
    }
    apCStack_110[0x20]->PrevSuccess = 0;
    local_124 = apCStack_110[0x20]->MinContext->NumStats - 1;
    do {
      pCVar13 = local_120 + 1;
      local_12c = local_120[1].Freq + local_12c;
      if (local_128 < local_12c) {
        pCVar6 = local_120 + 1;
        pCVar7 = local_120 + 1;
        local_120 = pCVar13;
        (**(code **)((long)apCStack_110[0x1f] + 8))
                  (apCStack_110[0x1f],local_12c - pCVar6->Freq,pCVar7->Freq);
        apCStack_110[0x20]->FoundState = local_120;
        local_12e = local_120->Symbol;
        Ppmd7_Update1((CPpmd7 *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680));
        return (uint)local_12e;
      }
      local_124 = local_124 + -1;
      local_120 = pCVar13;
    } while (local_124 != 0);
    if (apCStack_110[0x20]->MinContext->SummFreq <= local_128) {
      return -2;
    }
    apCStack_110[0x20]->HiBitsFlag =
         (uint)apCStack_110[0x20]->HB2Flag[apCStack_110[0x20]->FoundState->Symbol];
    (**(code **)((long)apCStack_110[0x1f] + 8))
              (apCStack_110[0x1f],local_12c,apCStack_110[0x20]->MinContext->SummFreq - local_12c);
    for (local_134 = 0; local_134 < 0x20; local_134 = local_134 + 8) {
      pcVar1 = acStack_118 + (ulong)local_134 * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 1) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 2) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 3) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 4) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 5) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 6) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
      pcVar1 = acStack_118 + (ulong)(local_134 + 7) * 8;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      pcVar1[4] = -1;
      pcVar1[5] = -1;
      pcVar1[6] = -1;
      pcVar1[7] = -1;
    }
    acStack_118[local_120->Symbol] = '\0';
    local_124 = apCStack_110[0x20]->MinContext->NumStats - 1;
    do {
      pCVar13 = local_120;
      local_120 = local_120 + -1;
      acStack_118[pCVar13[-1].Symbol] = '\0';
      local_124 = local_124 + -1;
    } while (local_124 != 0);
  }
  while( true ) {
    uVar10 = (uint)apCStack_110[0x20]->MinContext->NumStats;
    do {
      apCStack_110[0x20]->OrderFall = apCStack_110[0x20]->OrderFall + 1;
      if (apCStack_110[0x20]->MinContext->Suffix == 0) {
        return -1;
      }
      apCStack_110[0x20]->MinContext =
           (CPpmd7_Context *)(apCStack_110[0x20]->Base + apCStack_110[0x20]->MinContext->Suffix);
    } while (apCStack_110[0x20]->MinContext->NumStats == uVar10);
    local_95c = 0;
    local_96c = 0;
    uVar5 = apCStack_110[0x20]->MinContext->NumStats;
    local_950 = (CPpmd_State *)(apCStack_110[0x20]->Base + apCStack_110[0x20]->MinContext->Stats);
    do {
      cVar4 = acStack_118[local_950->Symbol];
      local_95c = ((uint)*(byte *)((long)local_950 + 1) & (int)cVar4) + local_95c;
      pbVar11 = (byte *)((long)local_950 + 6);
      local_948[local_96c] = (long)local_950;
      local_96c = local_96c - (int)cVar4;
      local_950 = (CPpmd_State *)pbVar11;
    } while (local_96c != uVar5 - uVar10);
    pCVar12 = Ppmd7_MakeEscFreq(apCStack_110[0x20],uVar10,&local_954);
    local_954 = local_95c + local_954;
    uVar10 = (**(code **)apCStack_110[0x1f])(apCStack_110[0x1f],local_954);
    if (uVar10 < local_95c) break;
    if (local_954 <= uVar10) {
      return -2;
    }
    (**(code **)((long)apCStack_110[0x1f] + 8))(apCStack_110[0x1f],local_95c,local_954 - local_95c);
    pCVar12->Summ = pCVar12->Summ + (short)local_954;
    do {
      local_96c = local_96c - 1;
      acStack_118[*(byte *)local_948[local_96c]] = '\0';
    } while (local_96c != 0);
  }
  local_988 = local_948;
  local_95c = 0;
  while (local_95c = *(byte *)(*local_988 + 1) + local_95c, local_95c <= uVar10) {
    local_988 = local_988 + 1;
  }
  local_950 = (CPpmd_State *)*local_988;
  (**(code **)((long)apCStack_110[0x1f] + 8))
            (apCStack_110[0x1f],local_95c - local_950->Freq,local_950->Freq);
  if ((pCVar12->Shift < 7) && (BVar8 = pCVar12->Count + 0xff, pCVar12->Count = BVar8, BVar8 == '\0')
     ) {
    pCVar12->Summ = pCVar12->Summ << 1;
    bVar14 = pCVar12->Shift;
    pCVar12->Shift = bVar14 + 1;
    pCVar12->Count = (Byte)(3 << (bVar14 & 0x1f));
  }
  apCStack_110[0x20]->FoundState = local_950;
  bVar14 = local_950->Symbol;
  Ppmd7_Update2((CPpmd7 *)0x1999d3);
  return (uint)bVar14;
}

Assistant:

static int Ppmd7_DecodeSymbol(CPpmd7 *p, IPpmd7_RangeDec *rc)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 1)
  {
    CPpmd_State *s = Ppmd7_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = rc->GetThreshold(rc, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      rc->Decode(rc, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats - 1;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        rc->Decode(rc, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd7_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    p->HiBitsFlag = p->HB2Flag[p->FoundState->Symbol];
    rc->Decode(rc, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats - 1;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd7_GetBinSumm(p);
    if (rc->DecodeBit(rc, *prob) == 0)
    {
      Byte symbol;
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd7Context_OneState(p->MinContext))->Symbol;
      Ppmd7_UpdateBin(p);
      return symbol;
    }
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD7_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd7Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd7_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd7_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);

    see = Ppmd7_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = rc->GetThreshold(rc, freqSum);

    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      rc->Decode(rc, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd7_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    rc->Decode(rc, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}